

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall
draco::Mesh::SetAttribute
          (Mesh *this,int att_id,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  size_type sVar1;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 *__new_size;
  PointCloud *in_stack_ffffffffffffffd0;
  undefined1 local_20 [20];
  int local_c;
  
  __new_size = local_20;
  local_c = in_ESI;
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::unique_ptr
            (in_RDX,in_stack_ffffffffffffffa8);
  PointCloud::SetAttribute
            (in_stack_ffffffffffffffd0,(int)((ulong)__new_size >> 0x20),
             (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  sVar1 = std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::size
                    ((vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
                      *)(in_RDI + 0xa8));
  if ((int)sVar1 <= local_c) {
    std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::resize
              ((vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_> *)
               in_stack_ffffffffffffffd0,(size_type)__new_size);
  }
  return;
}

Assistant:

void SetAttribute(int att_id, std::unique_ptr<PointAttribute> pa) override {
    PointCloud::SetAttribute(att_id, std::move(pa));
    if (static_cast<int>(attribute_data_.size()) <= att_id) {
      attribute_data_.resize(att_id + 1);
    }
  }